

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addTargets.cpp
# Opt level: O3

void helics::loadTags(value *section,
                     function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                     *tagAction)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Hash_node_base *p_Var2;
  bool bVar3;
  value_type *v;
  size_t sVar4;
  table_type *ptVar5;
  basic_value<toml::type_config> *extraout_RDX;
  basic_value<toml::type_config> *extraout_RDX_00;
  basic_value<toml::type_config> *tagValue_00;
  basic_value<toml::type_config> *tagValue_01;
  value *extraout_RDX_01;
  value *extraout_RDX_02;
  value *extraout_RDX_03;
  value *element;
  _Hash_node_base *p_Var6;
  long lVar7;
  ulong uVar8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tagPair;
  value_type tagValue;
  undefined1 local_178 [16];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  undefined1 local_128 [32];
  basic_string_view<char,_std::char_traits<char>_> local_108;
  undefined1 local_f8 [72];
  region local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_f8._0_8_ = local_f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"tags","");
  bVar3 = toml::basic_value<toml::type_config>::contains(section,(key_type *)local_f8);
  if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  if (bVar3) {
    local_168.first._M_dataplus._M_p = local_178 + 0x20;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_178 + 0x10),"tags","");
    v = toml::basic_value<toml::type_config>::at(section,(key_type *)(local_178 + 0x10));
    toml::basic_value<toml::type_config>::basic_value((basic_value<toml::type_config> *)local_f8,v);
    tagValue_00 = extraout_RDX;
    if (local_168.first._M_dataplus._M_p != local_178 + 0x20) {
      v = (value_type *)(local_168.first.field_2._M_allocated_capacity + 1);
      operator_delete(local_168.first._M_dataplus._M_p,(ulong)v);
      tagValue_00 = extraout_RDX_00;
    }
    if ((string)local_f8[0] == (string)0x9) {
      lVar7 = 0;
      uVar8 = 0;
      while( true ) {
        sVar4 = toml::basic_value<toml::type_config>::size
                          ((basic_value<toml::type_config> *)local_f8);
        if (sVar4 <= uVar8) break;
        v = (value_type *)(*(long *)local_f8._8_8_ + lVar7);
        getTagPair<toml::basic_value<toml::type_config>>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_178 + 0x10),(helics *)v,tagValue_01);
        if ((undefined1 *)local_168.first._M_string_length != (undefined1 *)0x0) {
          local_128._0_8_ = local_168.first._M_string_length;
          local_128._8_8_ = local_168.first._M_dataplus._M_p;
          local_178._0_8_ = local_168.second._M_string_length;
          local_178._8_8_ = local_168.second._M_dataplus._M_p;
          if ((tagAction->super__Function_base)._M_manager == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          v = (value_type *)local_128;
          (*tagAction->_M_invoker)
                    ((_Any_data *)tagAction,(basic_string_view<char,_std::char_traits<char>_> *)v,
                     (basic_string_view<char,_std::char_traits<char>_> *)local_178);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168.second._M_dataplus._M_p != &local_168.second.field_2) {
          v = (value_type *)(local_168.second.field_2._M_allocated_capacity + 1);
          operator_delete(local_168.second._M_dataplus._M_p,(ulong)v);
        }
        if (local_168.first._M_dataplus._M_p != local_178 + 0x20) {
          v = (value_type *)(local_168.first.field_2._M_allocated_capacity + 1);
          operator_delete(local_168.first._M_dataplus._M_p,(ulong)v);
        }
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 200;
      }
    }
    else {
      v = (value_type *)local_f8;
      getTagPair<toml::basic_value<toml::type_config>>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_178 + 0x10),(helics *)v,tagValue_00);
      if ((undefined1 *)local_168.first._M_string_length == (undefined1 *)0x0) {
        if ((string)local_f8[0] == (string)0xa) {
          ptVar5 = toml::basic_value<toml::type_config>::as_table_abi_cxx11_
                             ((basic_value<toml::type_config> *)local_f8);
          p_Var6 = (ptVar5->_M_h)._M_before_begin._M_nxt;
          if (p_Var6 != (_Hash_node_base *)0x0) {
            element = extraout_RDX_01;
            do {
              paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)p_Var6[1]._M_nxt;
              p_Var2 = p_Var6[2]._M_nxt;
              fileops::tomlAsString_abi_cxx11_((string *)local_128,(fileops *)(p_Var6 + 5),element);
              local_108._M_len = local_128._8_8_;
              local_108._M_str = (char *)local_128._0_8_;
              local_178._0_8_ = p_Var2;
              local_178._8_8_ = paVar1;
              if ((tagAction->super__Function_base)._M_manager == (_Manager_type)0x0) {
                std::__throw_bad_function_call();
              }
              v = (value_type *)local_178;
              (*tagAction->_M_invoker)
                        ((_Any_data *)tagAction,
                         (basic_string_view<char,_std::char_traits<char>_> *)local_178,&local_108);
              element = extraout_RDX_02;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 0x10)) {
                v = (value_type *)(local_128._16_8_ + 1);
                operator_delete((void *)local_128._0_8_,(ulong)v);
                element = extraout_RDX_03;
              }
              p_Var6 = p_Var6->_M_nxt;
            } while (p_Var6 != (_Hash_node_base *)0x0);
          }
        }
      }
      else {
        local_128._0_8_ = local_168.first._M_string_length;
        local_128._8_8_ = local_168.first._M_dataplus._M_p;
        local_178._0_8_ = local_168.second._M_string_length;
        local_178._8_8_ = local_168.second._M_dataplus._M_p;
        if ((tagAction->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        v = (value_type *)local_128;
        (*tagAction->_M_invoker)
                  ((_Any_data *)tagAction,(basic_string_view<char,_std::char_traits<char>_> *)v,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_178);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168.second._M_dataplus._M_p != &local_168.second.field_2) {
        v = (value_type *)(local_168.second.field_2._M_allocated_capacity + 1);
        operator_delete(local_168.second._M_dataplus._M_p,(ulong)v);
      }
      if (local_168.first._M_dataplus._M_p != local_178 + 0x20) {
        v = (value_type *)(local_168.first.field_2._M_allocated_capacity + 1);
        operator_delete(local_168.first._M_dataplus._M_p,(ulong)v);
      }
    }
    toml::basic_value<toml::type_config>::cleanup
              ((basic_value<toml::type_config> *)local_f8,(EVP_PKEY_CTX *)v);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    toml::detail::region::~region(&local_b0);
  }
  return;
}

Assistant:

void loadTags(const toml::value& section,
              const std::function<void(std::string_view, std::string_view)>& tagAction)
{
    if (section.contains("tags")) {
        auto tagValue = section.at("tags");
        if (tagValue.is_array()) {
            for (std::size_t ii = 0; ii < tagValue.size(); ++ii) {
                auto tagPair = getTagPair(tagValue[ii]);
                if (!tagPair.first.empty()) {
                    tagAction(tagPair.first, tagPair.second);
                }
            }
        } else {
            auto tagPair = getTagPair(tagValue);
            if (!tagPair.first.empty()) {
                tagAction(tagPair.first, tagPair.second);
            } else if (tagValue.is_table()) {
                for (auto& values : tagValue.as_table()) {
                    tagAction(values.first, fileops::tomlAsString(values.second));
                }
            }
        }
    }
}